

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiWindow *window_00;
  long lVar1;
  ImGuiContext *ctx;
  ImDrawList *pIVar2;
  ImGuiDockNode *buf_00;
  ImVec2 this;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ImGuiIO *pIVar8;
  char *pcVar9;
  ImGuiViewportP **ppIVar10;
  ImGuiPopupData *pIVar11;
  ImGuiTabBar *tab_bar;
  ImGuiStoragePair *pIVar12;
  ImGuiSettingsHandler *pIVar13;
  ImGuiWindow **ppIVar14;
  ImGuiViewport *viewport;
  char **ppcVar15;
  char *pcVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  ImDrawList *local_3d8;
  char *local_3b0;
  char *local_3a8;
  uint local_39c;
  char *local_390;
  uint local_384;
  char *local_380;
  char *local_378;
  char *local_370;
  ImGuiWindow *local_358;
  char *local_320;
  ImVec2 local_2e4;
  ImVec2 local_2dc;
  ImVec2 local_2d4;
  ImVec2 local_2cc;
  ImVec2 local_2c4;
  ImVec2 local_2bc;
  ImVec2 local_2b4;
  ImVec2 local_2ac;
  ImVec2 local_2a4;
  ImVec2 pos;
  ImVec2 local_294;
  ImVec2 local_28c;
  ImVec2 local_284;
  ImVec2 local_27c;
  ImVec2 local_274;
  ImVec2 local_26c;
  int local_264;
  ImDrawList *pIStack_260;
  int depth;
  ImDrawList *overlay_draw_list;
  ImGuiDockNode *node_1;
  char *p;
  char buf_1 [64];
  ImVec2 local_1fc;
  ImVec2 local_1f4;
  float local_1ec;
  char local_1e8 [4];
  float font_size;
  char buf [32];
  undefined1 local_1c0 [8];
  ImRect r_1;
  ImDrawList *draw_list;
  ImGuiWindow *window_2;
  int n_4;
  char *input_source_names [5];
  ImVec2 local_168;
  ImGuiWindowSettings *local_160;
  ImGuiWindowSettings *window_settings;
  ImGuiWindow *window_1;
  char *selected_tab_name;
  ImGuiDockNodeSettings *settings_2;
  ImGuiWindowSettings *pIStack_138;
  int n_3;
  ImGuiWindowSettings *settings_1;
  ImGuiDockContext *dc_1;
  ImGuiWindowSettings *settings;
  ImGuiDockNode *pIStack_118;
  int n_2;
  ImGuiDockNode *node;
  ImVector<ImGuiStorage::ImGuiStoragePair> *pIStack_108;
  int n_1;
  ImGuiDockContext *dc;
  ImGuiWindow *pIStack_f8;
  int n;
  ImGuiWindow *window;
  int i_2;
  int i_1;
  ImGuiPlatformMonitor *mon;
  byte local_d5;
  int i;
  float fStack_d0;
  bool open;
  ImRect r;
  int rect_n;
  ImGuiIO *io;
  ImGuiContext *g;
  char *trt_rects_names [11];
  char *local_48;
  char *wrt_rects_names [7];
  bool *p_open_local;
  
  wrt_rects_names[6] = p_open;
  bVar3 = Begin("Dear ImGui Metrics",p_open,0);
  if (bVar3) {
    memcpy(&local_48,&PTR_anon_var_dwarf_3d191_0020cb90,0x38);
    memcpy(&g,&PTR_anon_var_dwarf_3d191_0020cbd0,0x58);
    ctx = GImGui;
    pIVar8 = GetIO();
    pcVar9 = GetVersion();
    Text("Dear ImGui %s",pcVar9);
    Text("Application average %.3f ms/frame (%.1f FPS)",(double)(1000.0 / pIVar8->Framerate));
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)pIVar8->MetricsRenderVertices,
         (ulong)(uint)pIVar8->MetricsRenderIndices,
         (long)pIVar8->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)pIVar8->MetricsActiveWindows,
         (ulong)(uint)pIVar8->MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)pIVar8->MetricsActiveAllocations);
    Separator();
    bVar3 = TreeNode("Tools");
    if (bVar3) {
      ImVec2::ImVec2((ImVec2 *)&r.Max.y,0.0,0.0);
      bVar3 = Button("Item Picker..",(ImVec2 *)&r.Max.y);
      if (bVar3) {
        DebugStartItemPicker();
      }
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                       );
      Checkbox("Show windows begin order",&ShowMetricsWindow::show_windows_begin_order);
      Checkbox("Show windows rectangles",&ShowMetricsWindow::show_windows_rects);
      SameLine(0.0,-1.0);
      fVar18 = GetFontSize();
      SetNextItemWidth(fVar18 * 12.0);
      bVar4 = Combo("##show_windows_rect_type",&ShowMetricsWindow::show_windows_rect_type,&local_48,
                    7,7);
      bVar3 = (ShowMetricsWindow::show_windows_rects & 1U) != 0;
      ShowMetricsWindow::show_windows_rects = bVar3 || bVar4;
      if ((bVar3 || bVar4) && (ctx->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",ctx->NavWindow->Name);
        Indent(0.0);
        for (r.Max.x = 0.0; (int)r.Max.x < 7; r.Max.x = (float)((int)r.Max.x + 1)) {
          _i = ShowMetricsWindow::Funcs::GetWindowRect(ctx->NavWindow,(int)r.Max.x);
          dVar19 = (double)(float)i;
          dVar20 = (double)fStack_d0;
          dVar21 = (double)r.Min.x;
          dVar22 = (double)r.Min.y;
          fVar18 = ImRect::GetWidth((ImRect *)&i);
          fVar17 = ImRect::GetHeight((ImRect *)&i);
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",dVar19,dVar20,dVar21,dVar22,
               (double)fVar18,(double)fVar17,wrt_rects_names[(long)(int)r.Max.x + -1]);
        }
        Unindent(0.0);
      }
      Checkbox("Show mesh when hovering ImDrawCmd",&ShowMetricsWindow::show_drawcmd_mesh);
      Checkbox("Show bounding boxes when hovering ImDrawCmd",&ShowMetricsWindow::show_drawcmd_aabb);
      TreePop();
    }
    ShowMetricsWindow::Funcs::NodeWindows(&ctx->Windows,"Windows");
    bVar3 = TreeNode("Viewport","Viewports (%d)",(ulong)(uint)(ctx->Viewports).Size);
    if (bVar3) {
      fVar18 = GetTreeNodeToLabelSpacing();
      Indent(fVar18);
      ShowViewportThumbnails();
      fVar18 = GetTreeNodeToLabelSpacing();
      Unindent(fVar18);
      local_d5 = TreeNode("Monitors","Monitors (%d)",(ulong)(uint)(ctx->PlatformIO).Monitors.Size);
      SameLine(0.0,-1.0);
      MetricsHelpMarker(
                       "Dear ImGui uses monitor data:\n- to query DPI settings on a per monitor basis\n- to position popup/tooltips so they don\'t straddle monitors."
                       );
      if ((local_d5 & 1) != 0) {
        for (mon._4_4_ = 0; (int)mon._4_4_ < (ctx->PlatformIO).Monitors.Size;
            mon._4_4_ = mon._4_4_ + 1) {
          _i_2 = ImVector<ImGuiPlatformMonitor>::operator[](&(ctx->PlatformIO).Monitors,mon._4_4_);
          BulletText("Monitor #%d: DPI %.0f%%\n MainMin (%.0f,%.0f), MainMax (%.0f,%.0f), MainSize (%.0f,%.0f)\n WorkMin (%.0f,%.0f), WorkMax (%.0f,%.0f), WorkSize (%.0f,%.0f)"
                     ,(double)(_i_2->DpiScale * 100.0),(double)(_i_2->MainPos).x,
                     (double)(_i_2->MainPos).y,(double)((_i_2->MainPos).x + (_i_2->MainSize).x),
                     (double)((_i_2->MainPos).y + (_i_2->MainSize).y),(double)(_i_2->MainSize).x,
                     (double)(_i_2->MainSize).y,(double)(_i_2->WorkPos).x,(ulong)mon._4_4_);
        }
        TreePop();
      }
      for (window._4_4_ = 0; window._4_4_ < (ctx->Viewports).Size; window._4_4_ = window._4_4_ + 1)
      {
        ppIVar10 = ImVector<ImGuiViewportP_*>::operator[](&ctx->Viewports,window._4_4_);
        ShowMetricsWindow::Funcs::NodeViewport(*ppIVar10);
      }
      TreePop();
    }
    bVar3 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(ctx->OpenPopupStack).Size);
    if (bVar3) {
      for (window._0_4_ = 0; (int)window < (ctx->OpenPopupStack).Size;
          window._0_4_ = (int)window + 1) {
        pIVar11 = ImVector<ImGuiPopupData>::operator[](&ctx->OpenPopupStack,(int)window);
        pIStack_f8 = pIVar11->Window;
        pIVar11 = ImVector<ImGuiPopupData>::operator[](&ctx->OpenPopupStack,(int)window);
        if (pIStack_f8 == (ImGuiWindow *)0x0) {
          local_320 = "NULL";
        }
        else {
          local_320 = pIStack_f8->Name;
        }
        bVar3 = false;
        if (pIStack_f8 != (ImGuiWindow *)0x0) {
          bVar3 = (pIStack_f8->Flags & 0x1000000U) != 0;
        }
        pcVar9 = "";
        if (bVar3) {
          pcVar9 = " ChildWindow";
        }
        bVar3 = false;
        if (pIStack_f8 != (ImGuiWindow *)0x0) {
          bVar3 = (pIStack_f8->Flags & 0x10000000U) != 0;
        }
        pcVar16 = "";
        if (bVar3) {
          pcVar16 = " ChildMenu";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)pIVar11->PopupId,local_320,pcVar9,
                   pcVar16);
      }
      TreePop();
    }
    uVar5 = ImPool<ImGuiTabBar>::GetSize(&ctx->TabBars);
    bVar3 = TreeNode("TabBars","Tab Bars (%d)",(ulong)uVar5);
    if (bVar3) {
      for (dc._4_4_ = 0; iVar7 = dc._4_4_, iVar6 = ImPool<ImGuiTabBar>::GetSize(&ctx->TabBars),
          iVar7 < iVar6; dc._4_4_ = dc._4_4_ + 1) {
        tab_bar = ImPool<ImGuiTabBar>::GetByIndex(&ctx->TabBars,dc._4_4_);
        ShowMetricsWindow::Funcs::NodeTabBar(tab_bar);
      }
      TreePop();
    }
    bVar3 = TreeNode("Dock nodes");
    if (bVar3) {
      pIStack_108 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)&ctx->DockContext;
      Checkbox("List root nodes",&ShowMetricsWindow::root_nodes_only);
      Checkbox("Ctrl shows window dock info",&ShowMetricsWindow::show_docking_nodes);
      bVar3 = SmallButton("Clear nodes");
      if (bVar3) {
        DockContextClearNodes(ctx,0,true);
      }
      SameLine(0.0,-1.0);
      bVar3 = SmallButton("Rebuild all");
      if (bVar3) {
        *(bool *)&pIStack_108[3].Size = true;
      }
      for (node._4_4_ = 0; node._4_4_ < pIStack_108->Size; node._4_4_ = node._4_4_ + 1) {
        pIVar12 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](pIStack_108,node._4_4_);
        pIStack_118 = (ImGuiDockNode *)(pIVar12->field_1).val_p;
        if ((pIStack_118 != (ImGuiDockNode *)0x0) &&
           (((ShowMetricsWindow::root_nodes_only & 1U) == 0 ||
            (bVar3 = ImGuiDockNode::IsRootNode(pIStack_118), bVar3)))) {
          ShowMetricsWindow::Funcs::NodeDockNode(pIStack_118,"Node");
        }
      }
      TreePop();
    }
    bVar3 = TreeNode("Settings");
    if (bVar3) {
      bVar3 = SmallButton("Clear");
      if (bVar3) {
        ClearIniSettings();
      }
      SameLine(0.0,-1.0);
      bVar3 = SmallButton("Save to memory");
      if (bVar3) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      SameLine(0.0,-1.0);
      bVar3 = SmallButton("Save to disk");
      if (bVar3) {
        SaveIniSettingsToDisk((ctx->IO).IniFilename);
      }
      SameLine(0.0,-1.0);
      if ((ctx->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"",(ctx->IO).IniFilename);
      }
      Text("SettingsDirtyTimer %.2f",(double)ctx->SettingsDirtyTimer);
      bVar3 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(ctx->SettingsHandlers).Size);
      if (bVar3) {
        for (settings._4_4_ = 0; settings._4_4_ < (ctx->SettingsHandlers).Size;
            settings._4_4_ = settings._4_4_ + 1) {
          pIVar13 = ImVector<ImGuiSettingsHandler>::operator[]
                              (&ctx->SettingsHandlers,settings._4_4_);
          BulletText("%s",pIVar13->TypeName);
        }
        TreePop();
      }
      uVar5 = ImChunkStream<ImGuiWindowSettings>::size(&ctx->SettingsWindows);
      bVar3 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",(ulong)uVar5);
      if (bVar3) {
        for (dc_1 = (ImGuiDockContext *)
                    ImChunkStream<ImGuiWindowSettings>::begin(&ctx->SettingsWindows);
            dc_1 != (ImGuiDockContext *)0x0;
            dc_1 = (ImGuiDockContext *)
                   ImChunkStream<ImGuiWindowSettings>::next_chunk
                             (&ctx->SettingsWindows,(ImGuiWindowSettings *)dc_1)) {
          ShowMetricsWindow::Funcs::NodeWindowSettings((ImGuiWindowSettings *)dc_1);
        }
        TreePop();
      }
      bVar3 = TreeNode("SettingsDocking","Settings packed data: Docking");
      if (bVar3) {
        settings_1 = (ImGuiWindowSettings *)&ctx->DockContext;
        Text("In SettingsWindows:");
        for (pIStack_138 = ImChunkStream<ImGuiWindowSettings>::begin(&ctx->SettingsWindows);
            pIStack_138 != (ImGuiWindowSettings *)0x0;
            pIStack_138 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                                    (&ctx->SettingsWindows,pIStack_138)) {
          if (pIStack_138->DockId != 0) {
            pcVar9 = ImGuiWindowSettings::GetName(pIStack_138);
            BulletText("Window \'%s\' -> DockId %08X",pcVar9,(ulong)pIStack_138->DockId);
          }
        }
        Text("In SettingsNodes:");
        for (settings_2._4_4_ = 0; settings_2._4_4_ < (int)settings_1[1].ID;
            settings_2._4_4_ = settings_2._4_4_ + 1) {
          selected_tab_name =
               (char *)ImVector<ImGuiDockNodeSettings>::operator[]
                                 ((ImVector<ImGuiDockNodeSettings> *)(settings_1 + 1),
                                  settings_2._4_4_);
          window_1 = (ImGuiWindow *)0x0;
          if (((ImGuiDockNodeSettings *)selected_tab_name)->SelectedWindowId != 0) {
            window_settings =
                 (ImGuiWindowSettings *)
                 FindWindowByID(((ImGuiDockNodeSettings *)selected_tab_name)->SelectedWindowId);
            if ((ImGuiWindow *)window_settings == (ImGuiWindow *)0x0) {
              local_160 = FindWindowSettings(*(ImGuiID *)(selected_tab_name + 0xc));
              if (local_160 != (ImGuiWindowSettings *)0x0) {
                window_1 = (ImGuiWindow *)ImGuiWindowSettings::GetName(local_160);
              }
            }
            else {
              window_1 = (ImGuiWindow *)((ImGuiWindow *)window_settings)->Name;
            }
          }
          if (window_1 == (ImGuiWindow *)0x0) {
            local_358 = (ImGuiWindow *)0x1da0e5;
            if (*(int *)(selected_tab_name + 0xc) != 0) {
              local_358 = (ImGuiWindow *)0x1e337d;
            }
          }
          else {
            local_358 = window_1;
          }
          BulletText("Node %08X, Parent %08X, SelectedTab %08X (\'%s\')",
                     (ulong)*(uint *)selected_tab_name,(ulong)*(uint *)(selected_tab_name + 4),
                     (ulong)*(uint *)(selected_tab_name + 0xc),local_358);
        }
        TreePop();
      }
      uVar5 = ImGuiTextBuffer::size(&ctx->SettingsIniData);
      bVar3 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",(ulong)uVar5);
      if (bVar3) {
        pcVar9 = ImGuiTextBuffer::c_str(&ctx->SettingsIniData);
        iVar7 = (ctx->SettingsIniData).Buf.Size;
        ImVec2::ImVec2(&local_168,-1.1754944e-38,0.0);
        InputTextMultiline("##Ini",pcVar9,(long)iVar7,&local_168,0x4000,(ImGuiInputTextCallback)0x0,
                           (void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar3 = TreeNode("Internal state");
    if (bVar3) {
      memcpy(&stack0xfffffffffffffe68,&DAT_0020cc30,0x28);
      Text("WINDOWING");
      Indent(0.0);
      if (ctx->HoveredWindow == (ImGuiWindow *)0x0) {
        local_370 = "NULL";
      }
      else {
        local_370 = ctx->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",local_370);
      if (ctx->HoveredRootWindow == (ImGuiWindow *)0x0) {
        local_378 = "NULL";
      }
      else {
        local_378 = ctx->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",local_378);
      if (ctx->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) {
        local_380 = "NULL";
      }
      else {
        local_380 = ctx->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",local_380);
      if (ctx->HoveredDockNode == (ImGuiDockNode *)0x0) {
        local_384 = 0;
      }
      else {
        local_384 = ctx->HoveredDockNode->ID;
      }
      Text("HoveredDockNode: 0x%08X",(ulong)local_384);
      if (ctx->MovingWindow == (ImGuiWindow *)0x0) {
        local_390 = "NULL";
      }
      else {
        local_390 = ctx->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",local_390);
      if (ctx->MouseLastHoveredViewport == (ImGuiViewportP *)0x0) {
        local_39c = 0;
      }
      else {
        local_39c = (ctx->MouseLastHoveredViewport->super_ImGuiViewport).ID;
      }
      Text("MouseViewport: 0x%08X (UserHovered 0x%08X, LastHovered 0x%08X)",
           (ulong)(ctx->MouseViewport->super_ImGuiViewport).ID,(ulong)(ctx->IO).MouseHoveredViewport
           ,(ulong)local_39c);
      Unindent(0.0);
      Text("ITEMS");
      Indent(0.0);
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (double)ctx->ActiveIdTimer,(ulong)ctx->ActiveId,(ulong)ctx->ActiveIdPreviousFrame,
           (ulong)(ctx->ActiveIdAllowOverlap & 1),
           *(undefined8 *)(&stack0xfffffffffffffe68 + (ulong)ctx->ActiveIdSource * 8));
      if (ctx->ActiveIdWindow == (ImGuiWindow *)0x0) {
        local_3a8 = "NULL";
      }
      else {
        local_3a8 = ctx->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",local_3a8);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(double)ctx->HoveredIdTimer,
           (ulong)ctx->HoveredId,(ulong)ctx->HoveredIdPreviousFrame,
           (ulong)(ctx->HoveredIdAllowOverlap & 1));
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)(ctx->DragDropActive & 1),(ulong)(ctx->DragDropPayload).SourceId,
           (ctx->DragDropPayload).DataType,(ulong)(uint)(ctx->DragDropPayload).DataSize);
      Unindent(0.0);
      Text("NAV,FOCUS");
      Indent(0.0);
      if (ctx->NavWindow == (ImGuiWindow *)0x0) {
        local_3b0 = "NULL";
      }
      else {
        local_3b0 = ctx->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",local_3b0);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)ctx->NavId,(ulong)ctx->NavLayer);
      Text("NavInputSource: %s",
           *(undefined8 *)(&stack0xfffffffffffffe68 + (ulong)ctx->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)((ctx->IO).NavActive & 1),
           (ulong)((ctx->IO).NavVisible & 1));
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)ctx->NavActivateId,
           (ulong)ctx->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)(ctx->NavDisableHighlight & 1)
           ,(ulong)(ctx->NavDisableMouseHover & 1));
      Text("NavFocusScopeId = 0x%08X",(ulong)ctx->NavFocusScopeId);
      Text("NavWindowingTarget: \'%s\'");
      Unindent(0.0);
      TreePop();
    }
    if (((ShowMetricsWindow::show_windows_rects & 1U) != 0) ||
       ((ShowMetricsWindow::show_windows_begin_order & 1U) != 0)) {
      for (window_2._4_4_ = 0; window_2._4_4_ < (ctx->Windows).Size;
          window_2._4_4_ = window_2._4_4_ + 1) {
        ppIVar14 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,window_2._4_4_);
        window_00 = *ppIVar14;
        if ((window_00->WasActive & 1U) != 0) {
          r_1.Max = (ImVec2)GetForegroundDrawList(window_00);
          if ((ShowMetricsWindow::show_windows_rects & 1U) != 0) {
            _local_1c0 = ShowMetricsWindow::Funcs::GetWindowRect
                                   (window_00,ShowMetricsWindow::show_windows_rect_type);
            ImDrawList::AddRect((ImDrawList *)r_1.Max,(ImVec2 *)local_1c0,&r_1.Min,0xff8000ff,0.0,
                                0xf,1.0);
          }
          if (((ShowMetricsWindow::show_windows_begin_order & 1U) != 0) &&
             ((window_00->Flags & 0x1000000U) == 0)) {
            ImFormatString(local_1e8,0x20,"%d",(ulong)(uint)(int)window_00->BeginOrderWithinContext)
            ;
            local_1ec = GetFontSize();
            this = r_1.Max;
            ImVec2::ImVec2(&local_1fc,local_1ec,local_1ec);
            local_1f4 = operator+(&window_00->Pos,&local_1fc);
            ImDrawList::AddRectFilled
                      ((ImDrawList *)this,&window_00->Pos,&local_1f4,0xff6464c8,0.0,0xf);
            ImDrawList::AddText((ImDrawList *)r_1.Max,&window_00->Pos,0xffffffff,local_1e8,
                                (char *)0x0);
          }
        }
      }
    }
    if ((((ShowMetricsWindow::show_docking_nodes & 1U) != 0) && (((ctx->IO).KeyCtrl & 1U) != 0)) &&
       (ctx->HoveredDockNode != (ImGuiDockNode *)0x0)) {
      memset(&p,0,0x40);
      node_1 = (ImGuiDockNode *)&p;
      overlay_draw_list = (ImDrawList *)ctx->HoveredDockNode;
      if (*(ImGuiWindow **)&overlay_draw_list->_Path == (ImGuiWindow *)0x0) {
        viewport = GetMainViewport();
        local_3d8 = GetForegroundDrawList(viewport);
      }
      else {
        local_3d8 = GetForegroundDrawList(*(ImGuiWindow **)&overlay_draw_list->_Path);
      }
      buf_00 = node_1;
      pIStack_260 = local_3d8;
      lVar1 = 0x38 - (long)node_1;
      uVar5 = (overlay_draw_list->CmdBuffer).Size;
      bVar3 = ImGuiDockNode::IsCentralNode((ImGuiDockNode *)overlay_draw_list);
      pcVar9 = "";
      if (bVar3) {
        pcVar9 = " *CentralNode*";
      }
      iVar7 = ImFormatString((char *)buf_00,(size_t)(buf_1 + lVar1),"DockId: %X%s\n",(ulong)uVar5,
                             pcVar9);
      node_1 = (ImGuiDockNode *)((long)node_1->ChildNodes + (long)iVar7 + -0x18);
      iVar7 = ImFormatString((char *)node_1,(size_t)(buf_1 + (0x38 - (long)node_1)),
                             "WindowClass: %08X\n",
                             (ulong)*(uint *)((long)&overlay_draw_list->_IdxWritePtr + 4));
      node_1 = (ImGuiDockNode *)((long)node_1->ChildNodes + (long)iVar7 + -0x18);
      iVar7 = ImFormatString((char *)node_1,(size_t)(buf_1 + (0x38 - (long)node_1)),
                             "Size: (%.0f, %.0f)\n",(double)(float)overlay_draw_list->_VtxCurrentIdx
                             ,(double)*(float *)&overlay_draw_list->field_0x4c);
      node_1 = (ImGuiDockNode *)((long)node_1->ChildNodes + (long)iVar7 + -0x18);
      iVar7 = ImFormatString((char *)node_1,(size_t)(buf_1 + (0x38 - (long)node_1)),
                             "SizeRef: (%.0f, %.0f)\n",
                             (double)*(float *)&overlay_draw_list->_VtxWritePtr,
                             (double)*(float *)((long)&overlay_draw_list->_VtxWritePtr + 4));
      node_1 = (ImGuiDockNode *)((long)node_1->ChildNodes + (long)iVar7 + -0x18);
      local_264 = DockNodeGetDepth((ImGuiDockNode *)overlay_draw_list);
      pIVar2 = pIStack_260;
      ppcVar15 = &overlay_draw_list->_OwnerName;
      ImVec2::ImVec2(&local_27c,3.0,3.0);
      local_274 = operator*(&local_27c,(float)local_264);
      local_26c = operator+((ImVec2 *)ppcVar15,&local_274);
      local_28c = operator+((ImVec2 *)&overlay_draw_list->_OwnerName,
                            (ImVec2 *)&overlay_draw_list->_VtxCurrentIdx);
      ImVec2::ImVec2(&pos,3.0,3.0);
      local_294 = operator*(&pos,(float)local_264);
      local_284 = operator-(&local_28c,&local_294);
      ImDrawList::AddRect(pIVar2,&local_26c,&local_284,0xff6464c8,0.0,0xf,1.0);
      ppcVar15 = &overlay_draw_list->_OwnerName;
      ImVec2::ImVec2(&local_2b4,3.0,3.0);
      local_2ac = operator*(&local_2b4,(float)local_264);
      local_2a4 = operator+((ImVec2 *)ppcVar15,&local_2ac);
      pIVar2 = pIStack_260;
      ImVec2::ImVec2(&local_2c4,1.0,1.0);
      local_2bc = operator-(&local_2a4,&local_2c4);
      local_2dc = CalcTextSize((char *)&p,(char *)0x0,false,-1.0);
      local_2d4 = operator+(&local_2a4,&local_2dc);
      ImVec2::ImVec2(&local_2e4,1.0,1.0);
      local_2cc = operator+(&local_2d4,&local_2e4);
      ImDrawList::AddRectFilled(pIVar2,&local_2bc,&local_2cc,0xff6464c8,0.0,0xf);
      ImDrawList::AddText(pIStack_260,(ImFont *)0x0,0.0,&local_2a4,0xffffffff,(char *)&p,(char *)0x0
                          ,0.0,(ImVec4 *)0x0);
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("Dear ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentRowsFrozen, TRT_ColumnsContentRowsUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentRowsFrozen", "ColumnsContentRowsUnfrozen" };

    // State
    static bool show_windows_rects = false;
    static int  show_windows_rect_type = WRT_WorkRect;
    static bool show_windows_begin_order = false;
    static bool show_tables_rects = false;
    static int  show_tables_rect_type = TRT_WorkRect;
    static bool show_drawcmd_mesh = true;
    static bool show_drawcmd_aabb = true;
    static bool show_docking_nodes = false;

    // Basic info
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d active allocations", io.MetricsActiveAllocations);
    ImGui::Separator();

    // Helper functions to display common structures:
    // - NodeDrawList()
    // - NodeColumns()
    // - NodeWindow()
    // - NodeWindows()
    // - NodeViewport()
    // - NodeDockNode()
    // - NodeTabBar()
    // - NodeStorage()
    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }

        static void NodeDrawCmdShowMeshAndBoundingBox(ImDrawList* fg_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }

        // Note that both 'window' and 'viewport' may be NULL here. Viewport is generally null of destroyed popups which previously owned a viewport.
        static void NodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
            if (window && fg_draw_list && ImGui::IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper;
                clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
                    {
                        char* buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            ImGui::Text("(In front-to-back order:)");
            for (int i = windows.Size - 1; i >= 0; i--) // Iterate front to back
            {
                ImGui::PushID(windows[i]);
                Funcs::NodeWindow(windows[i], "Window");
                ImGui::PopID();
            }
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }

            ImGuiContext& g = *GImGui;
            const bool is_active = window->WasActive;
            ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            const bool open = ImGui::TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
            if (!is_active) { PopStyleColor(); }
            if (ImGui::IsItemHovered() && is_active)
                ImGui::GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->Viewport, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("WindowClassId: 0x%08X", window->WindowClass.ClassId);
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            ImGui::BulletText("Viewport: %d%s, ViewportId: 0x%08X, ViewportPos: (%.1f,%.1f)", window->Viewport ? window->Viewport->Idx : -1, window->ViewportOwned ? " (Owned)" : "", window->ViewportId, window->ViewportPos.x, window->ViewportPos.y);
            ImGui::BulletText("ViewportMonitor: %d", window->Viewport ? window->Viewport->PlatformMonitor : -1);
            ImGui::BulletText("DockId: 0x%04X, DockOrder: %d, Act: %d, Vis: %d", window->DockId, window->DockOrder, window->DockIsActive, window->DockTabIsVisible);
            if (window->DockNode || window->DockNodeAsHost)
                NodeDockNode(window->DockNodeAsHost ? window->DockNodeAsHost : window->DockNode, window->DockNodeAsHost ? "DockNodeAsHost" : "DockNode");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->RootWindowDockStop != window->RootWindow) NodeWindow(window->RootWindowDockStop, "RootWindowDockStop");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }

        static void NodeWindowSettings(ImGuiWindowSettings* settings)
        {
            ImGui::Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",
                settings->ID, settings->GetName(), settings->Pos.x, settings->Pos.y, settings->Size.x, settings->Size.y, settings->Collapsed);
        }

        static void NodeViewport(ImGuiViewportP* viewport)
        {
            ImGui::SetNextItemOpen(true, ImGuiCond_Once);
            if (ImGui::TreeNode((void*)(intptr_t)viewport->ID, "Viewport #%d, ID: 0x%08X, Parent: 0x%08X, Window: \"%s\"", viewport->Idx, viewport->ID, viewport->ParentViewportId, viewport->Window ? viewport->Window->Name : "N/A"))
            {
                ImGuiWindowFlags flags = viewport->Flags;
                ImGui::BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f\nMonitor: %d, DpiScale: %.0f%%",
                    viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
                    viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y,
                    viewport->PlatformMonitor, viewport->DpiScale * 100.0f);
                if (viewport->Idx > 0) { ImGui::SameLine(); if (ImGui::SmallButton("Reset Pos")) { viewport->Pos = ImVec2(200,200); if (viewport->Window) viewport->Window->Pos = ImVec2(200,200); } }
                ImGui::BulletText("Flags: 0x%04X =%s%s%s%s%s%s%s", viewport->Flags,
                    (flags & ImGuiViewportFlags_CanHostOtherWindows) ? " CanHostOtherWindows" : "", (flags & ImGuiViewportFlags_NoDecoration) ? " NoDecoration" : "",
                    (flags & ImGuiViewportFlags_NoFocusOnAppearing)  ? " NoFocusOnAppearing"  : "", (flags & ImGuiViewportFlags_NoInputs)     ? " NoInputs"     : "",
                    (flags & ImGuiViewportFlags_NoRendererClear)     ? " NoRendererClear"     : "", (flags & ImGuiViewportFlags_Minimized)    ? " Minimized"    : "",
                    (flags & ImGuiViewportFlags_NoAutoMerge)         ? " NoAutoMerge"         : "");
                for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                    for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                        Funcs::NodeDrawList(NULL, viewport, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
                ImGui::TreePop();
            }
        }

        static void NodeDockNode(ImGuiDockNode* node, const char* label)
        {
            ImGuiContext& g = *GImGui;
            const bool is_alive = (g.FrameCount - node->LastFrameAlive < 2);    // Submitted with ImGuiDockNodeFlags_KeepAliveOnly
            const bool is_active = (g.FrameCount - node->LastFrameActive < 2);  // Submitted
            if (!is_alive) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            bool open;
            if (node->Windows.Size > 0)
                open = ImGui::TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %d windows (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", node->Windows.Size, node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
            else
                open = ImGui::TreeNode((void*)(intptr_t)node->ID, "%s 0x%04X%s: %s split (vis: '%s')", label, node->ID, node->IsVisible ? "" : " (hidden)", (node->SplitAxis == ImGuiAxis_X) ? "horizontal" : (node->SplitAxis == ImGuiAxis_Y) ? "vertical" : "n/a", node->VisibleWindow ? node->VisibleWindow->Name : "NULL");
            if (!is_alive) { PopStyleColor(); }
            if (is_active && ImGui::IsItemHovered())
                if (ImGuiWindow* window = node->HostWindow ? node->HostWindow : node->VisibleWindow)
                    GetForegroundDrawList(window)->AddRect(node->Pos, node->Pos + node->Size, IM_COL32(255, 255, 0, 255));
            if (open)
            {
                IM_ASSERT(node->ChildNodes[0] == NULL || node->ChildNodes[0]->ParentNode == node);
                IM_ASSERT(node->ChildNodes[1] == NULL || node->ChildNodes[1]->ParentNode == node);
                ImGui::BulletText("Pos (%.0f,%.0f), Size (%.0f, %.0f) Ref (%.0f, %.0f)",
                    node->Pos.x, node->Pos.y, node->Size.x, node->Size.y, node->SizeRef.x, node->SizeRef.y);
                NodeWindow(node->HostWindow, "HostWindow");
                NodeWindow(node->VisibleWindow, "VisibleWindow");
                ImGui::BulletText("SelectedTabID: 0x%08X, LastFocusedNodeID: 0x%08X", node->SelectedTabId, node->LastFocusedNodeId);
                ImGui::BulletText("Misc:%s%s%s%s%s",
                    node->IsDockSpace() ? " IsDockSpace" : "",
                    node->IsCentralNode() ? " IsCentralNode" : "",
                    is_alive ? " IsAlive" : "", is_active ? " IsActive" : "",
                    node->WantLockSizeOnce ? " WantLockSizeOnce" : "");
                if (ImGui::TreeNode("flags", "LocalFlags: 0x%04X SharedFlags: 0x%04X", node->LocalFlags, node->SharedFlags))
                {
                    ImGui::CheckboxFlags("LocalFlags: NoDocking", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoDocking);
                    ImGui::CheckboxFlags("LocalFlags: NoSplit", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoSplit);
                    ImGui::CheckboxFlags("LocalFlags: NoResize", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoResize);
                    ImGui::CheckboxFlags("LocalFlags: NoResizeX", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoResizeX);
                    ImGui::CheckboxFlags("LocalFlags: NoResizeY", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoResizeY);
                    ImGui::CheckboxFlags("LocalFlags: NoTabBar", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoTabBar);
                    ImGui::CheckboxFlags("LocalFlags: HiddenTabBar", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_HiddenTabBar);
                    ImGui::CheckboxFlags("LocalFlags: NoWindowMenuButton", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoWindowMenuButton);
                    ImGui::CheckboxFlags("LocalFlags: NoCloseButton", (ImU32*)&node->LocalFlags, ImGuiDockNodeFlags_NoCloseButton);
                    ImGui::TreePop();
                }
                if (node->ParentNode)
                    NodeDockNode(node->ParentNode, "ParentNode");
                if (node->ChildNodes[0])
                    NodeDockNode(node->ChildNodes[0], "Child[0]");
                if (node->ChildNodes[1])
                    NodeDockNode(node->ChildNodes[1], "Child[1]");
                if (node->TabBar)
                    NodeTabBar(node->TabBar);
                ImGui::TreePop();
            }
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernible strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            const bool is_active = (tab_bar->PrevFrameVisible >= ImGui::GetFrameCount() - 2);
            p += ImFormatString(p, buf_end - p, "Tab Bar 0x%08X (%d tabs)%s", tab_bar->ID, tab_bar->Tabs.Size, is_active ? "" : " *Inactive*");
            p += ImFormatString(p, buf_end - p, "  { ");
            for (int tab_n = 0; tab_n < ImMin(tab_bar->Tabs.Size, 3); tab_n++)
            {
                ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                p += ImFormatString(p, buf_end - p, "%s'%s'",
                    tab_n > 0 ? ", " : "", (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???");
            }
            p += ImFormatString(p, buf_end - p, (tab_bar->Tabs.Size > 3) ? " ... }" : " } ");
            if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
            bool open = ImGui::TreeNode(tab_bar, "%s", buf);
            if (!is_active) { PopStyleColor(); }
            if (is_active && ImGui::IsItemHovered())
            {
                ImDrawList* draw_list = ImGui::GetForegroundDrawList();
                draw_list->AddRect(tab_bar->BarRect.Min, tab_bar->BarRect.Max, IM_COL32(255, 255, 0, 255));
                draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMinX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
                draw_list->AddLine(ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Min.y), ImVec2(tab_bar->ScrollingRectMaxX, tab_bar->BarRect.Max.y), IM_COL32(0, 255, 0, 255));
            }
            if (open)
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueReorder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueReorder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X '%s' Offset: %.1f, Width: %.1f/%.1f",
                        tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID, (tab->Window || tab->NameOffset != -1) ? tab_bar->GetTabName(tab) : "???", tab->Offset, tab->Width, tab->ContentWidth);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }

        static void NodeStorage(ImGuiStorage* storage, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s: %d entries, %d bytes", label, storage->Data.Size, storage->Data.size_in_bytes()))
                return;
            for (int n = 0; n < storage->Data.Size; n++)
            {
                const ImGuiStorage::ImGuiStoragePair& p = storage->Data[n];
                ImGui::BulletText("Key 0x%08X Value { i: %d }", p.key, p.val_i); // Important: we currently don't store a type, real value may not be integer.
            }
            ImGui::TreePop();
        }
    };

    // Tools
    if (ImGui::TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (ImGui::Button("Item Picker.."))
            ImGui::DebugStartItemPicker();
        ImGui::SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        ImGui::Checkbox("Show windows begin order", &show_windows_begin_order);
        ImGui::Checkbox("Show windows rectangles", &show_windows_rects);
        ImGui::SameLine();
        ImGui::SetNextItemWidth(ImGui::GetFontSize() * 12);
        show_windows_rects |= ImGui::Combo("##show_windows_rect_type", &show_windows_rect_type, wrt_rects_names, WRT_Count, WRT_Count);
        if (show_windows_rects && g.NavWindow)
        {
            ImGui::BulletText("'%s':", g.NavWindow->Name);
            ImGui::Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                ImGui::Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            ImGui::Unindent();
        }
        ImGui::Checkbox("Show mesh when hovering ImDrawCmd", &show_drawcmd_mesh);
        ImGui::Checkbox("Show bounding boxes when hovering ImDrawCmd", &show_drawcmd_aabb);
        ImGui::TreePop();
    }

    // Contents
    Funcs::NodeWindows(g.Windows, "Windows");
    //Funcs::NodeWindows(g.WindowsFocusOrder, "WindowsFocusOrder");
    if (ImGui::TreeNode("Viewport", "Viewports (%d)", g.Viewports.Size))
    {
        ImGui::Indent(ImGui::GetTreeNodeToLabelSpacing());
        ImGui::ShowViewportThumbnails();
        ImGui::Unindent(ImGui::GetTreeNodeToLabelSpacing());
        bool open = ImGui::TreeNode("Monitors", "Monitors (%d)", g.PlatformIO.Monitors.Size);
        ImGui::SameLine();
        MetricsHelpMarker("Dear ImGui uses monitor data:\n- to query DPI settings on a per monitor basis\n- to position popup/tooltips so they don't straddle monitors.");
        if (open)
        {
            for (int i = 0; i < g.PlatformIO.Monitors.Size; i++)
            {
                const ImGuiPlatformMonitor& mon = g.PlatformIO.Monitors[i];
                ImGui::BulletText("Monitor #%d: DPI %.0f%%\n MainMin (%.0f,%.0f), MainMax (%.0f,%.0f), MainSize (%.0f,%.0f)\n WorkMin (%.0f,%.0f), WorkMax (%.0f,%.0f), WorkSize (%.0f,%.0f)",
                    i, mon.DpiScale * 100.0f,
                    mon.MainPos.x, mon.MainPos.y, mon.MainPos.x + mon.MainSize.x, mon.MainPos.y + mon.MainSize.y, mon.MainSize.x, mon.MainSize.y,
                    mon.WorkPos.x, mon.WorkPos.y, mon.WorkPos.x + mon.WorkSize.x, mon.WorkPos.y + mon.WorkSize.y, mon.WorkSize.x, mon.WorkSize.y);
            }
            ImGui::TreePop();
        }
        for (int i = 0; i < g.Viewports.Size; i++)
            Funcs::NodeViewport(g.Viewports[i]);
        ImGui::TreePop();
    }

    // Details for Popups
    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }

    // Details for TabBars
    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }

    // Details for Tables
    IM_UNUSED(trt_rects_names);
    IM_UNUSED(show_tables_rects);
    IM_UNUSED(show_tables_rect_type);
#ifdef IMGUI_HAS_TABLE
    if (ImGui::TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            Funcs::NodeTable(g.Tables.GetByIndex(n));
        ImGui::TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (ImGui::TreeNode("Dock nodes"))
    {
        static bool root_nodes_only = true;
        ImGuiDockContext* dc = &g.DockContext;
        ImGui::Checkbox("List root nodes", &root_nodes_only);
        ImGui::Checkbox("Ctrl shows window dock info", &show_docking_nodes);
        if (ImGui::SmallButton("Clear nodes")) { DockContextClearNodes(&g, 0, true); }
        ImGui::SameLine();
        if (ImGui::SmallButton("Rebuild all")) { dc->WantFullRebuild = true; }
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (!root_nodes_only || node->IsRootNode())
                    Funcs::NodeDockNode(node, "Node");
        ImGui::TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (ImGui::TreeNode("Settings"))
    {
        if (ImGui::SmallButton("Clear"))
            ImGui::ClearIniSettings();
        ImGui::SameLine();
        if (ImGui::SmallButton("Save to memory"))
            ImGui::SaveIniSettingsToMemory();
        ImGui::SameLine();
        if (ImGui::SmallButton("Save to disk"))
            ImGui::SaveIniSettingsToDisk(g.IO.IniFilename);
        ImGui::SameLine();
        if (g.IO.IniFilename)
            ImGui::Text("\"%s\"", g.IO.IniFilename);
        else
            ImGui::TextUnformatted("<NULL>");
        ImGui::Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (ImGui::TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                ImGui::BulletText("%s", g.SettingsHandlers[n].TypeName);
            ImGui::TreePop();
        }
        if (ImGui::TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                Funcs::NodeWindowSettings(settings);
            ImGui::TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (ImGui::TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                Funcs::NodeTableSettings(settings);
            ImGui::TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
        if (ImGui::TreeNode("SettingsDocking", "Settings packed data: Docking"))
        {
            ImGuiDockContext* dc = &g.DockContext;
            ImGui::Text("In SettingsWindows:");
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                if (settings->DockId != 0)
                    ImGui::BulletText("Window '%s' -> DockId %08X", settings->GetName(), settings->DockId);
            ImGui::Text("In SettingsNodes:");
            for (int n = 0; n < dc->NodesSettings.Size; n++)
            {
                ImGuiDockNodeSettings* settings = &dc->NodesSettings[n];
                const char* selected_tab_name = NULL;
                if (settings->SelectedWindowId)
                {
                    if (ImGuiWindow* window = FindWindowByID(settings->SelectedWindowId))
                        selected_tab_name = window->Name;
                    else if (ImGuiWindowSettings* window_settings = FindWindowSettings(settings->SelectedWindowId))
                        selected_tab_name = window_settings->GetName();
                }
                ImGui::BulletText("Node %08X, Parent %08X, SelectedTab %08X ('%s')", settings->ID, settings->ParentNodeId, settings->SelectedWindowId, selected_tab_name ? selected_tab_name : settings->SelectedWindowId ? "N/A" : "");
            }
            ImGui::TreePop();
        }
#endif // #ifdef IMGUI_HAS_DOCK

        if (ImGui::TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            ImGui::InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, 0.0f), ImGuiInputTextFlags_ReadOnly);
            ImGui::TreePop();
        }
        ImGui::TreePop();
    }

    // Misc Details
    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        ImGui::Text("WINDOWING");
        ImGui::Indent();
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        ImGui::Text("HoveredDockNode: 0x%08X", g.HoveredDockNode ? g.HoveredDockNode->ID : 0);
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("MouseViewport: 0x%08X (UserHovered 0x%08X, LastHovered 0x%08X)", g.MouseViewport->ID, g.IO.MouseHoveredViewport, g.MouseLastHoveredViewport ? g.MouseLastHoveredViewport->ID : 0);
        ImGui::Unindent();

        ImGui::Text("ITEMS");
        ImGui::Indent();
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::Unindent();

        ImGui::Text("NAV,FOCUS");
        ImGui::Indent();
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Unindent();

        ImGui::TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (show_windows_rects || show_windows_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (show_windows_rects)
            {
                ImRect r = Funcs::GetWindowRect(window, show_windows_rect_type);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (show_windows_begin_order && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = ImGui::GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (show_tables_rects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl && g.HoveredDockNode)
    {
        char buf[64] = "";
        char* p = buf;
        ImGuiDockNode* node = g.HoveredDockNode;
        ImDrawList* overlay_draw_list = node->HostWindow ? GetForegroundDrawList(node->HostWindow) : GetForegroundDrawList((ImGuiViewportP*)GetMainViewport());
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "DockId: %X%s\n", node->ID, node->IsCentralNode() ? " *CentralNode*" : "");
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "WindowClass: %08X\n", node->WindowClass.ClassId);
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "Size: (%.0f, %.0f)\n", node->Size.x, node->Size.y);
        p += ImFormatString(p, buf + IM_ARRAYSIZE(buf) - p, "SizeRef: (%.0f, %.0f)\n", node->SizeRef.x, node->SizeRef.y);
        int depth = DockNodeGetDepth(node);
        overlay_draw_list->AddRect(node->Pos + ImVec2(3, 3) * (float)depth, node->Pos + node->Size - ImVec2(3, 3) * (float)depth, IM_COL32(200, 100, 100, 255));
        ImVec2 pos = node->Pos + ImVec2(3, 3) * (float)depth;
        overlay_draw_list->AddRectFilled(pos - ImVec2(1, 1), pos + CalcTextSize(buf) + ImVec2(1, 1), IM_COL32(200, 100, 100, 255));
        overlay_draw_list->AddText(NULL, 0.0f, pos, IM_COL32(255, 255, 255, 255), buf);
    }
#endif // #ifdef IMGUI_HAS_DOCK

    ImGui::End();
}